

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall
cnn::SimpleSGDTrainer::update
          (SimpleSGDTrainer *this,
          vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *lookup_params,
          vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *params,real scale)

{
  uint uVar1;
  bool bVar2;
  reference ppPVar3;
  reference ppLVar4;
  reference puVar5;
  undefined8 in_RDX;
  undefined8 in_RSI;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_RDI;
  float in_XMM0_Da;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg_1;
  uint i;
  iterator __end2;
  iterator __begin2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range2;
  LookupParameters *p_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *__range1_1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  reg;
  Parameters *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *__range1;
  float gscale;
  Trainer *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd48;
  float in_stack_fffffffffffffd4c;
  LookupParameters *in_stack_fffffffffffffd50;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
  *in_stack_fffffffffffffd58;
  StorageBaseType *in_stack_fffffffffffffd60;
  float *in_stack_fffffffffffffd68;
  float *in_stack_fffffffffffffd70;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd78;
  _Node_iterator_base<unsigned_int,_false> local_1a8;
  _Node_iterator_base<unsigned_int,_false> local_1a0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_198;
  LookupParameters *local_190;
  LookupParameters **local_188;
  __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
  local_180;
  undefined8 local_178;
  float local_13c;
  Parameters *local_40;
  Parameters **local_38;
  __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
  local_30;
  undefined8 local_28;
  float local_20;
  float local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_1c = in_XMM0_Da;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = Trainer::clip_gradients(in_stack_fffffffffffffd30);
  local_28 = local_18;
  local_30._M_current =
       (Parameters **)
       std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::begin
                 ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)in_RDI);
  local_38 = (Parameters **)
             std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>::end
                       ((vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_> *)in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
                        *)in_RDI);
    if (!bVar2) break;
    ppPVar3 = __gnu_cxx::
              __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppPVar3;
    Tensor::vec((Tensor *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator*
              (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    local_13c = *(float *)((long)&(in_RDI->_M_h)._M_bucket_count + 4) * local_1c * local_20;
    Tensor::vec((Tensor *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    Eigen::operator*(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const>>
    ::operator+(in_stack_fffffffffffffd58,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                 *)in_stack_fffffffffffffd50);
    Tensor::vec((Tensor *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::operator-=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffd50,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
    Parameters::clear((Parameters *)0x6bd4ca);
    __gnu_cxx::
    __normal_iterator<cnn::Parameters_*const_*,_std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>
    ::operator++(&local_30);
  }
  local_178 = local_10;
  local_180._M_current =
       (LookupParameters **)
       std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::begin
                 ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_> *)
                  in_RDI);
  local_188 = (LookupParameters **)
              std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>::end
                        ((vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                          *)in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_stack_fffffffffffffd30,
                       (__normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
                        *)in_RDI);
    if (!bVar2) break;
    ppLVar4 = __gnu_cxx::
              __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
              ::operator*(&local_180);
    local_190 = *ppLVar4;
    local_198 = &local_190->non_zero_grads;
    local_1a0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::begin(in_RDI);
    local_1a8._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end(in_RDI);
    while( true ) {
      bVar2 = std::__detail::operator!=(&local_1a0,&local_1a8);
      if (!bVar2) break;
      puVar5 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                         ((_Node_iterator<unsigned_int,_true,_false> *)0x6bd5b5);
      uVar1 = *puVar5;
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_190->values,(ulong)uVar1);
      Tensor::vec((Tensor *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_190->grads,(ulong)uVar1);
      Tensor::vec((Tensor *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      in_stack_fffffffffffffd4c =
           *(float *)((long)&(in_RDI->_M_h)._M_bucket_count + 4) * local_1c * local_20;
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator*(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const>>
      ::operator+((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)in_stack_fffffffffffffd58,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>
                   *)in_stack_fffffffffffffd50);
      std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                (&local_190->values,(ulong)uVar1);
      Tensor::vec((Tensor *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
      operator-=((MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffffd50,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
                ((_Node_iterator<unsigned_int,_true,_false> *)in_stack_fffffffffffffd30);
    }
    LookupParameters::clear(in_stack_fffffffffffffd50);
    __gnu_cxx::
    __normal_iterator<cnn::LookupParameters_*const_*,_std::vector<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>_>
    ::operator++(&local_180);
  }
  *(float *)&(in_RDI->_M_h)._M_rehash_policy._M_next_resize =
       *(float *)&(in_RDI->_M_h)._M_rehash_policy._M_next_resize + 1.0;
  return;
}

Assistant:

void SimpleSGDTrainer::update(const std::vector<LookupParameters*> &lookup_params, const std::vector<Parameters*> &params, real scale) {
  const float gscale = clip_gradients();
  for (auto p : params) {
#if HAVE_CUDA
    gpu::sgd_update(p->values.d.size(), p->g.v, p->values.v, eta * scale * gscale, lambda);
#else
    auto reg = (p->values.vec()) * lambda;
    p->values.vec() -= ((eta * scale * gscale) * p->g.vec() + reg);
#endif
    p->clear();
  }
  for (auto p : lookup_params) {
    for (auto i : p->non_zero_grads) {
#if HAVE_CUDA
      gpu::sgd_update(p->values[i].d.size(), p->grads[i].v, p->values[i].v, eta * scale * gscale, lambda);
#else
      auto reg = (p->values[i].vec()) * lambda;
      p->values[i].vec() -= (p->grads[i].vec() * (eta * scale * gscale) + reg);
#endif
    }
    p->clear();
  }
  ++updates;
}